

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

GenerateBlockSymbol * __thiscall
slang::BumpAllocator::
emplace<slang::ast::GenerateBlockSymbol,slang::ast::Compilation&,char_const(&)[1],slang::SourceLocation&,unsigned_int,bool&>
          (BumpAllocator *this,Compilation *args,char (*args_1) [1],SourceLocation *args_2,
          uint *args_3,bool *args_4)

{
  char (*compilation) [1];
  GenerateBlockSymbol *this_00;
  string_view local_48;
  bool *local_38;
  bool *args_local_4;
  uint *args_local_3;
  SourceLocation *args_local_2;
  char (*args_local_1) [1];
  Compilation *args_local;
  BumpAllocator *this_local;
  
  local_38 = args_4;
  args_local_4 = (bool *)args_3;
  args_local_3 = (uint *)args_2;
  args_local_2 = (SourceLocation *)args_1;
  args_local_1 = (char (*) [1])args;
  args_local = (Compilation *)this;
  this_00 = (GenerateBlockSymbol *)allocate(this,0x80,8);
  compilation = args_local_1;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_48,(char *)args_local_2);
  ast::GenerateBlockSymbol::GenerateBlockSymbol
            (this_00,(Compilation *)compilation,local_48,*(SourceLocation *)args_local_3,
             *(uint32_t *)args_local_4,(bool)(*local_38 & 1));
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }